

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirementsForOperand
          (TrimCapabilitiesPass *this,Operand *operand,CapabilitySet *capabilities,
          ExtensionSet *extensions)

{
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  spv_result_t sVar4;
  size_t sVar5;
  uint **ppuVar6;
  uint32_t i;
  int iVar7;
  uint **ppuVar8;
  spv_operand_desc_t *desc;
  Capability local_34;
  
  sVar5 = utils::SmallVector<unsigned_int,_2UL>::size(&operand->words);
  if (((sVar5 == 1) &&
      (uVar2 = operand->type - SPV_OPERAND_TYPE_ID,
      uVar2 = uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f, 1 < uVar2)) && (uVar2 != 5)) {
    if ((uVar2 == 2) &&
       (this_00.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               *)&(((((this->super_Pass).context_)->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                  memory_model_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       , this_00.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
         (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0)) {
      uVar3 = Instruction::GetSingleWordInOperand
                        ((Instruction *)
                         this_00.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,1)
      ;
      if (uVar3 == 3) {
        local_34 = CapabilityVulkanMemoryModelDeviceScope;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&desc,capabilities,
                   &local_34);
      }
    }
    bVar1 = spvOperandIsConcreteMask(operand->type);
    if (bVar1) {
      for (iVar7 = 0; iVar7 != 0x20; iVar7 = iVar7 + 1) {
        ppuVar6 = (uint **)(operand->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        if (ppuVar6 == (uint **)0x0) {
          ppuVar6 = &(operand->words).small_data_;
        }
        uVar2 = 1 << ((byte)iVar7 & 0x1f) & **ppuVar6;
        if (uVar2 != 0) {
          desc = (spv_operand_desc_t *)0x0;
          sVar4 = AssemblyGrammar::lookupOperand
                            (&((this->super_Pass).context_)->grammar_,operand->type,uVar2,&desc);
          if (sVar4 == SPV_SUCCESS) {
            addSupportedCapabilitiesToSet<spv_operand_desc_t>(this,desc,capabilities);
            addSupportedExtensionsToSet<spv_operand_desc_t>(this,desc,extensions);
          }
        }
      }
    }
    else {
      desc = (spv_operand_desc_t *)0x0;
      ppuVar6 = (uint **)(operand->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar8 = &(operand->words).small_data_;
      if (ppuVar6 != (uint **)0x0) {
        ppuVar8 = ppuVar6;
      }
      sVar4 = AssemblyGrammar::lookupOperand
                        (&((this->super_Pass).context_)->grammar_,operand->type,**ppuVar8,&desc);
      if (sVar4 == SPV_SUCCESS) {
        addSupportedCapabilitiesToSet<spv_operand_desc_t>(this,desc,capabilities);
        addSupportedExtensionsToSet<spv_operand_desc_t>(this,desc,extensions);
      }
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::addInstructionRequirementsForOperand(
    const Operand& operand, CapabilitySet* capabilities,
    ExtensionSet* extensions) const {
  // No supported capability relies on a 2+-word operand.
  if (operand.words.size() != 1) {
    return;
  }

  // No supported capability relies on a literal string operand or an ID.
  if (operand.type == SPV_OPERAND_TYPE_LITERAL_STRING ||
      operand.type == SPV_OPERAND_TYPE_ID ||
      operand.type == SPV_OPERAND_TYPE_RESULT_ID) {
    return;
  }

  // If the Vulkan memory model is declared and any instruction uses Device
  // scope, the VulkanMemoryModelDeviceScope capability must be declared. This
  // rule cannot be covered by the grammar, so must be checked explicitly.
  if (operand.type == SPV_OPERAND_TYPE_SCOPE_ID) {
    const Instruction* memory_model = context()->GetMemoryModel();
    if (memory_model && memory_model->GetSingleWordInOperand(1u) ==
                            uint32_t(spv::MemoryModel::Vulkan)) {
      capabilities->insert(spv::Capability::VulkanMemoryModelDeviceScope);
    }
  }

  // case 1: Operand is a single value, can directly lookup.
  if (!spvOperandIsConcreteMask(operand.type)) {
    const spv_operand_desc_t* desc = {};
    auto result = context()->grammar().lookupOperand(operand.type,
                                                     operand.words[0], &desc);
    if (result != SPV_SUCCESS) {
      return;
    }
    addSupportedCapabilitiesToSet(desc, capabilities);
    addSupportedExtensionsToSet(desc, extensions);
    return;
  }

  // case 2: operand can be a bitmask, we need to decompose the lookup.
  for (uint32_t i = 0; i < 32; i++) {
    const uint32_t mask = (1 << i) & operand.words[0];
    if (!mask) {
      continue;
    }

    const spv_operand_desc_t* desc = {};
    auto result = context()->grammar().lookupOperand(operand.type, mask, &desc);
    if (result != SPV_SUCCESS) {
      continue;
    }

    addSupportedCapabilitiesToSet(desc, capabilities);
    addSupportedExtensionsToSet(desc, extensions);
  }
}